

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O2

bool __thiscall
SqModules::reloadModule
          (SqModules *this,char *fn,bool must_exist,char *__name__,Object *exports,
          string *out_err_msg)

{
  bool bVar1;
  string errMsg;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  std::_Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>::_Vector_impl_data::
  _M_swap_data((_Vector_impl_data *)&this->modules,(_Vector_impl_data *)&this->prevModules);
  std::vector<SqModules::Module,_std::allocator<SqModules::Module>_>::clear(&this->modules);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  bVar1 = requireModule(this,fn,must_exist,__name__,exports,out_err_msg);
  std::vector<SqModules::Module,_std::allocator<SqModules::Module>_>::clear(&this->prevModules);
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool SqModules::reloadModule(const char *fn, bool must_exist, const char *__name__, Sqrat::Object &exports, string &out_err_msg)
{
  SQRAT_ASSERT(prevModules.empty());

  modules.swap(prevModules);
  modules.clear(); // just in case

  string errMsg;
  bool res = requireModule(fn, must_exist, __name__, exports, out_err_msg);

  prevModules.clear();

  return res;
}